

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O0

void spvtools::utils::PrintTimerDescription(ostream *out,bool measure_mem_usage)

{
  _Setw _Var1;
  ostream *poVar2;
  bool measure_mem_usage_local;
  ostream *out_local;
  
  if (out != (ostream *)0x0) {
    _Var1 = std::setw(0x1e);
    poVar2 = std::operator<<(out,_Var1);
    poVar2 = std::operator<<(poVar2,"PASS name");
    _Var1 = std::setw(0xc);
    poVar2 = std::operator<<(poVar2,_Var1);
    poVar2 = std::operator<<(poVar2,"CPU time");
    _Var1 = std::setw(0xc);
    poVar2 = std::operator<<(poVar2,_Var1);
    poVar2 = std::operator<<(poVar2,"WALL time");
    _Var1 = std::setw(0xc);
    poVar2 = std::operator<<(poVar2,_Var1);
    poVar2 = std::operator<<(poVar2,"USR time");
    _Var1 = std::setw(0xc);
    poVar2 = std::operator<<(poVar2,_Var1);
    std::operator<<(poVar2,"SYS time");
    if (measure_mem_usage) {
      _Var1 = std::setw(0xc);
      poVar2 = std::operator<<(out,_Var1);
      poVar2 = std::operator<<(poVar2,"RSS delta");
      _Var1 = std::setw(0x10);
      poVar2 = std::operator<<(poVar2,_Var1);
      std::operator<<(poVar2,"PGFault delta");
    }
    std::ostream::operator<<(out,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void PrintTimerDescription(std::ostream* out, bool measure_mem_usage) {
  if (out) {
    *out << std::setw(30) << "PASS name" << std::setw(12) << "CPU time"
         << std::setw(12) << "WALL time" << std::setw(12) << "USR time"
         << std::setw(12) << "SYS time";
    if (measure_mem_usage) {
      *out << std::setw(12) << "RSS delta" << std::setw(16) << "PGFault delta";
    }
    *out << std::endl;
  }
}